

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstats.cpp
# Opt level: O0

bool kernel::ComputeUTXOStats<HashWriter>
               (CCoinsView *view,CCoinsStats *stats,HashWriter hash_obj,
               function<void_()> *interruption_point)

{
  bool bVar1;
  uint uVar2;
  pointer pCVar3;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *outputs_00;
  undefined8 uVar4;
  long in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000020;
  char (*in_stack_00000030) [17];
  unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_> pcursor;
  Coin coin;
  COutPoint key;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  outputs;
  Txid prevkey;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  char *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *in_stack_fffffffffffffea0;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *in_stack_fffffffffffffeb0;
  CCoinsStats *in_stack_fffffffffffffeb8;
  HashWriter *in_stack_fffffffffffffec0;
  undefined1 *flag;
  int in_stack_fffffffffffffeec;
  int iVar5;
  byte local_d9;
  ConstevalFormatString<1U> in_stack_ffffffffffffff28;
  string_view in_stack_ffffffffffffff30;
  string_view in_stack_ffffffffffffff40;
  undefined1 local_b0 [52];
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined8 local_6c;
  undefined8 uStack_64;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  flag = &stack0x00000008;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (**(code **)(*in_RDI + 0x28))(&stack0xffffffffffffff48);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_> *)
                     CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  if (!bVar1) {
    __assert_fail("pcursor",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/coinstats.cpp"
                  ,0x77,
                  "bool kernel::ComputeUTXOStats(CCoinsView *, CCoinsStats &, T, const std::function<void ()> &) [T = HashWriter]"
                 );
  }
  transaction_identifier<false>::transaction_identifier
            ((transaction_identifier<false> *)
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  std::
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  ::map((map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
         *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  while( true ) {
    pCVar3 = std::unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_>::operator->
                       ((unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_> *)
                        CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    uVar2 = (*pCVar3->_vptr_CCoinsViewCursor[4])();
    if ((uVar2 & 1) == 0) break;
    bVar1 = std::function::operator_cast_to_bool
                      ((function<void_()> *)
                       CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    if (bVar1) {
      _GLOBAL__N_1::std::function<void_()>::operator()
                ((function<void_()> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
      ;
    }
    COutPoint::COutPoint((COutPoint *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
    ;
    Coin::Coin((Coin *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    pCVar3 = std::unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_>::operator->
                       ((unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_> *)
                        CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    uVar2 = (*pCVar3->_vptr_CCoinsViewCursor[2])(pCVar3,&local_7c);
    if ((uVar2 & 1) == 0) {
LAB_00fe9ae6:
      in_stack_fffffffffffffe88 = "ComputeUTXOStats";
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                 in_stack_fffffffffffffe90);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                 in_stack_fffffffffffffe90);
      in_stack_fffffffffffffe80 = "%s: unable to read value\n";
      in_stack_fffffffffffffe78 = 4;
      in_stack_fffffffffffffeb8 = (CCoinsStats *)in_stack_fffffffffffffe88;
      LogPrintFormatInternal<char[17]>
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff30,in_stack_fffffffffffffeec,
                 (LogFlags)flag,in_stack_00000020,in_stack_ffffffffffffff28,in_stack_00000030);
      local_d9 = 0;
      iVar5 = 1;
    }
    else {
      pCVar3 = std::unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_>::operator->
                         ((unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_> *)
                          CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      uVar2 = (*pCVar3->_vptr_CCoinsViewCursor[3])(pCVar3,local_b0);
      if ((uVar2 & 1) == 0) goto LAB_00fe9ae6;
      bVar1 = std::
              map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
              ::empty((map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                       *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      if ((!bVar1) &&
         (bVar1 = transaction_identifier<false>::operator!=
                            ((transaction_identifier<false> *)in_stack_fffffffffffffe88,
                             (transaction_identifier<false> *)in_stack_fffffffffffffe80), bVar1)) {
        transaction_identifier::operator_cast_to_uint256_
                  ((transaction_identifier<false> *)
                   CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        ApplyStats((CCoinsStats *)in_stack_fffffffffffffe88,(uint256 *)in_stack_fffffffffffffe80,
                   (map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        ApplyHash<HashWriter>
                  (in_stack_fffffffffffffec0,(Txid *)in_stack_fffffffffffffeb8,
                   in_stack_fffffffffffffeb0);
        std::
        map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
        ::clear((map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                 *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      }
      local_18 = local_6c;
      uStack_10 = uStack_64;
      local_28 = local_7c;
      uStack_20 = uStack_74;
      in_stack_fffffffffffffec0 =
           (HashWriter *)
           std::
           map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
           ::operator[](in_stack_fffffffffffffea0,
                        (key_type_conflict3 *)
                        CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
      Coin::operator=((Coin *)in_stack_fffffffffffffe88,(Coin *)in_stack_fffffffffffffe80);
      *(long *)(in_RSI + 0x78) = *(long *)(in_RSI + 0x78) + 1;
      pCVar3 = std::unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_>::operator->
                         ((unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_> *)
                          CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      (*pCVar3->_vptr_CCoinsViewCursor[5])();
      iVar5 = 0;
    }
    Coin::~Coin((Coin *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    if (iVar5 != 0) goto LAB_00fe9c79;
    in_stack_fffffffffffffeec = 0;
  }
  bVar1 = std::
          map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
          ::empty((map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  if (!bVar1) {
    outputs_00 = (map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                  *)transaction_identifier::operator_cast_to_uint256_
                              ((transaction_identifier<false> *)
                               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    ApplyStats((CCoinsStats *)in_stack_fffffffffffffe88,(uint256 *)in_stack_fffffffffffffe80,
               (map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    ApplyHash<HashWriter>(in_stack_fffffffffffffec0,(Txid *)in_stack_fffffffffffffeb8,outputs_00);
  }
  FinalizeHash((HashWriter *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
               (CCoinsStats *)0xfe9c3e);
  uVar4 = (**(code **)(*in_RDI + 0x40))();
  *(undefined8 *)(in_RSI + 0x60) = uVar4;
  local_d9 = 1;
LAB_00fe9c79:
  std::
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  ::~map((map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
          *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  std::unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_>::~unique_ptr
            ((unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_> *)
             in_stack_fffffffffffffe88);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_d9 & 1);
}

Assistant:

static bool ComputeUTXOStats(CCoinsView* view, CCoinsStats& stats, T hash_obj, const std::function<void()>& interruption_point)
{
    std::unique_ptr<CCoinsViewCursor> pcursor(view->Cursor());
    assert(pcursor);

    Txid prevkey;
    std::map<uint32_t, Coin> outputs;
    while (pcursor->Valid()) {
        if (interruption_point) interruption_point();
        COutPoint key;
        Coin coin;
        if (pcursor->GetKey(key) && pcursor->GetValue(coin)) {
            if (!outputs.empty() && key.hash != prevkey) {
                ApplyStats(stats, prevkey, outputs);
                ApplyHash(hash_obj, prevkey, outputs);
                outputs.clear();
            }
            prevkey = key.hash;
            outputs[key.n] = std::move(coin);
            stats.coins_count++;
        } else {
            LogError("%s: unable to read value\n", __func__);
            return false;
        }
        pcursor->Next();
    }
    if (!outputs.empty()) {
        ApplyStats(stats, prevkey, outputs);
        ApplyHash(hash_obj, prevkey, outputs);
    }

    FinalizeHash(hash_obj, stats);

    stats.nDiskSize = view->EstimateSize();

    return true;
}